

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int decrypt_packet(ptls_cipher_context_t *header_protection,
                  _func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr *aead_cb
                  ,void *aead_ctx,uint64_t *next_expected_pn,quicly_decoded_packet_t *packet,
                  uint64_t *pn,ptls_iovec_t *payload)

{
  int iVar1;
  byte bVar2;
  ulong *in_RCX;
  quicly_conn_t *in_RDX;
  code *in_RSI;
  uint64_t *in_RDI;
  long *in_R8;
  ulong *in_R9;
  ptls_iovec_t pVar3;
  uint64_t *unaff_retaddr;
  undefined8 *in_stack_00000008;
  quicly_conn_t *conn;
  ptls_cipher_context_t *in_stack_00000018;
  int ret;
  uint8_t *local_50;
  size_t local_48;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_R8[0xe] == -1) {
    iVar1 = do_decrypt_packet(in_stack_00000018,
                              (_func_int_void_ptr_uint64_t_quicly_decoded_packet_t_ptr_size_t_size_t_ptr
                               *)conn,in_stack_00000008,unaff_retaddr,
                              (quicly_decoded_packet_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              (ptls_iovec_t *)pn);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  else {
    pVar3 = ptls_iovec_init((void *)(*in_R8 + in_R8[0xc]),in_R8[1] - in_R8[0xc]);
    local_50 = pVar3.base;
    *in_stack_00000008 = local_50;
    local_48 = pVar3.len;
    in_stack_00000008[1] = local_48;
    *in_R9 = in_R8[0xe];
    if (((in_RSI == aead_decrypt_1rtt) &&
        ((in_RDX->application->cipher).ingress.key_phase.decrypted < (ulong)in_R8[0xf])) &&
       (iVar1 = received_key_update(in_RDX,in_R8[0xf]), iVar1 != 0)) {
      return iVar1;
    }
    if (*in_RCX < *in_R9) {
      *in_RCX = *in_R9 + 1;
    }
  }
  bVar2 = 0x18;
  if ((*(byte *)*in_R8 & 0x80) != 0) {
    bVar2 = 0xc;
  }
  if ((*(byte *)*in_R8 & bVar2) == 0) {
    if (in_stack_00000008[1] == 0) {
      iVar1 = 0x2000a;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0x2000a;
  }
  return iVar1;
}

Assistant:

static int decrypt_packet(ptls_cipher_context_t *header_protection,
                          int (*aead_cb)(void *, uint64_t, quicly_decoded_packet_t *, size_t, size_t *), void *aead_ctx,
                          uint64_t *next_expected_pn, quicly_decoded_packet_t *packet, uint64_t *pn, ptls_iovec_t *payload)
{
    int ret;

    /* decrypt ourselves, or use the pre-decrypted input */
    if (packet->decrypted.pn == UINT64_MAX) {
        if ((ret = do_decrypt_packet(header_protection, aead_cb, aead_ctx, next_expected_pn, packet, pn, payload)) != 0)
            return ret;
    } else {
        *payload = ptls_iovec_init(packet->octets.base + packet->encrypted_off, packet->octets.len - packet->encrypted_off);
        *pn = packet->decrypted.pn;
        if (aead_cb == aead_decrypt_1rtt) {
            quicly_conn_t *conn = aead_ctx;
            if (conn->application->cipher.ingress.key_phase.decrypted < packet->decrypted.key_phase) {
                if ((ret = received_key_update(conn, packet->decrypted.key_phase)) != 0)
                    return ret;
            }
        }
        if (*next_expected_pn < *pn)
            *next_expected_pn = *pn + 1;
    }

    /* check reserved bits after AEAD decryption */
    if ((packet->octets.base[0] & (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0]) ? QUICLY_LONG_HEADER_RESERVED_BITS
                                                                                        : QUICLY_SHORT_HEADER_RESERVED_BITS)) !=
        0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: non-zero reserved bits (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }
    if (payload->len == 0) {
        if (QUICLY_DEBUG)
            fprintf(stderr, "%s: payload length is zero (pn: %" PRIu64 ")\n", __FUNCTION__, *pn);
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    }

    if (QUICLY_DEBUG) {
        char *payload_hex = quicly_hexdump(payload->base, payload->len, 4);
        fprintf(stderr, "%s: AEAD payload:\n%s", __FUNCTION__, payload_hex);
        free(payload_hex);
    }

    return 0;
}